

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

void __thiscall clipp::group::depth_first_traverser::undo(depth_first_traverser *this,memento *m)

{
  pointer *ppcVar1;
  int iVar2;
  pointer pcVar3;
  pointer pcVar4;
  child_t<clipp::parameter,_clipp::group> *pcVar5;
  context *pcVar6;
  size_type __n;
  long lVar7;
  context *pcVar8;
  pointer pcVar9;
  context *pcVar10;
  pointer pcVar11;
  int iVar12;
  int iVar13;
  
  iVar2 = m->level_;
  if (0 < (long)iVar2) {
    pcVar11 = (this->stack_).
              super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pcVar3 = (this->stack_).
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar13 = (int)((ulong)((long)pcVar11 - (long)pcVar3) >> 3);
    iVar12 = iVar13 * -0x55555555;
    if (iVar2 == iVar12 || SBORROW4(iVar2,iVar12) != iVar2 + iVar13 * 0x55555555 < 0) {
      pcVar3 = pcVar3 + iVar2;
      if (pcVar3 != pcVar11) {
        (this->stack_).
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_finish = pcVar3;
        pcVar11 = pcVar3;
      }
      pcVar11[-1].end._M_current = (m->context_).end._M_current;
      pcVar5 = (m->context_).cur._M_current;
      pcVar11[-1].parent = (m->context_).parent;
      pcVar11[-1].cur._M_current = pcVar5;
      return;
    }
    if (iVar2 == 1 && pcVar3 == pcVar11) {
      if (pcVar11 ==
          (this->stack_).
          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __n = std::
              vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
              ::_M_check_len(&this->stack_,1,"vector::_M_realloc_insert");
        pcVar3 = (this->stack_).
                 super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar4 = (this->stack_).
                 super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        lVar7 = (long)pcVar11 - (long)pcVar3 >> 3;
        if (__n == 0) {
          pcVar8 = (context *)0x0;
        }
        else {
          pcVar8 = __gnu_cxx::new_allocator<clipp::group::depth_first_traverser::context>::allocate
                             ((new_allocator<clipp::group::depth_first_traverser::context> *)this,
                              __n,(void *)0x0);
        }
        (&pcVar8->end)[lVar7]._M_current = (m->context_).end._M_current;
        pcVar5 = (m->context_).cur._M_current;
        (&pcVar8->parent)[lVar7] = (m->context_).parent;
        ((const_iterator *)(&pcVar8->parent + lVar7 + 1))->_M_current = pcVar5;
        pcVar10 = pcVar8;
        for (pcVar9 = pcVar3; pcVar9 != pcVar11; pcVar9 = pcVar9 + 1) {
          (pcVar10->end)._M_current = (pcVar9->end)._M_current;
          pcVar5 = (pcVar9->cur)._M_current;
          pcVar10->parent = pcVar9->parent;
          (pcVar10->cur)._M_current = pcVar5;
          pcVar10 = pcVar10 + 1;
        }
        for (; pcVar6 = pcVar10 + 1, pcVar4 != pcVar11; pcVar11 = pcVar11 + 1) {
          pcVar10[1].end._M_current = (pcVar11->end)._M_current;
          pcVar5 = (pcVar11->cur)._M_current;
          pcVar6->parent = pcVar11->parent;
          pcVar10[1].cur._M_current = pcVar5;
          pcVar10 = pcVar6;
        }
        if (pcVar3 != (pointer)0x0) {
          operator_delete(pcVar3);
        }
        (this->stack_).
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_start = pcVar8;
        (this->stack_).
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_finish = pcVar6;
        (this->stack_).
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pcVar8 + __n;
        return;
      }
      (pcVar11->end)._M_current = (m->context_).end._M_current;
      pcVar5 = (m->context_).cur._M_current;
      pcVar11->parent = (m->context_).parent;
      (pcVar11->cur)._M_current = pcVar5;
      ppcVar1 = &(this->stack_).
                 super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
  }
  return;
}

Assistant:

void undo(const memento& m) {
            if(m.level_ < 1) return;
            if(m.level_ <= int(stack_.size())) {
                stack_.erase(stack_.begin() + m.level_, stack_.end());
                stack_.back() = m.context_;
            }
            else if(stack_.empty() && m.level_ == 1) {
                stack_.push_back(m.context_);
            }
        }